

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

void __thiscall google::protobuf::internal::CachedSize::Set(CachedSize *this,int size)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *in_RDI = in_ESI;
  return;
}

Assistant:

void Set(int size) { size_.store(size, std::memory_order_relaxed); }